

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O3

ll128 * __thiscall
reed_solomn::lc(ll128 *__return_storage_ptr__,reed_solomn *this,
               vector<__int128,_std::allocator<__int128>_> *A)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  vector<__int128,_std::allocator<__int128>_> local_38;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            (&local_38,(vector<__int128,_std::allocator<__int128>_> *)this);
  uVar5 = (ulong)((long)local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  uVar1 = uVar5;
  do {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) {
      uVar4 = 0;
      uVar1 = 0;
      uVar6 = 0;
      uVar3 = 0;
      if (local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0011b25d;
      break;
    }
    uVar6 = (ulong)((uint)uVar1 & 0x7fffffff);
    uVar3 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar3;
  } while ((long)local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] == 0 &&
           *(long *)((long)local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar6 * 0x10 + 8) == 0);
  uVar4 = uVar3;
  uVar1 = uVar6;
  operator_delete(local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_38.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_0011b25d:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"deg: ",5);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return (ll128 *)this->_vptr_reed_solomn[uVar1 * 2];
}

Assistant:

ll128 reed_solomn::lc(vector<ll128> A) {
    int deg = degree(A);
    cout << "deg: " << deg << endl;
    return A[deg];
}